

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonBondedInteractionsSectionParser.cpp
# Opt level: O1

NonBondedInteractionTypeEnum __thiscall
OpenMD::NonBondedInteractionsSectionParser::getNonBondedInteractionTypeEnum
          (NonBondedInteractionsSectionParser *this,string *str)

{
  _Rb_tree_color _Var1;
  iterator iVar2;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
          ::find(&(this->stringToEnumMap_)._M_t,str);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header) {
    _Var1 = 0xb;
  }
  else {
    _Var1 = iVar2._M_node[2]._M_color;
  }
  return _Var1;
}

Assistant:

NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum
      NonBondedInteractionsSectionParser::getNonBondedInteractionTypeEnum(
          const std::string& str) {
    std::map<std::string, NonBondedInteractionTypeEnum>::iterator i;
    i = stringToEnumMap_.find(str);

    return i == stringToEnumMap_.end() ? Unknown : i->second;
  }